

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject.h
# Opt level: O3

shared_ptr<ICrawler> __thiscall
cinject::
CastInstanceRetriever<Snake,_ICrawler,_cinject::InstanceStorage<Snake,_cinject::ConstructorFactory<Snake,_void>_>_>
::forwardInstance(CastInstanceRetriever<Snake,_ICrawler,_cinject::InstanceStorage<Snake,_cinject::ConstructorFactory<Snake,_void>_>_>
                  *this,InjectionContext *context)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<ICrawler> sVar2;
  IInstanceRetriever local_20;
  element_type *local_18;
  
  (**(code **)((context->componentStack_).
               super__Vector_base<cinject::component_type,_std::allocator<cinject::component_type>_>
               ._M_impl.super__Vector_impl_data._M_start)->typeInfo)(&local_20);
  if (local_20._vptr_IInstanceRetriever == (_func_int **)0x0) {
    (this->super_InstanceRetriever<ICrawler>).super_IInstanceRetriever._vptr_IInstanceRetriever =
         (_func_int **)0x0;
    (this->storage_).
    super___shared_ptr<cinject::InstanceStorage<Snake,_cinject::ConstructorFactory<Snake,_void>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
  }
  else {
    (this->super_InstanceRetriever<ICrawler>).super_IInstanceRetriever._vptr_IInstanceRetriever =
         local_20._vptr_IInstanceRetriever;
    (this->storage_).
    super___shared_ptr<cinject::InstanceStorage<Snake,_cinject::ConstructorFactory<Snake,_void>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = local_18;
    if (local_18 != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&local_18->field_0x8 = *(int *)&local_18->field_0x8 + 1;
        UNLOCK();
      }
      else {
        *(int *)&local_18->field_0x8 = *(int *)&local_18->field_0x8 + 1;
      }
    }
  }
  _Var1._M_pi = extraout_RDX;
  if (local_18 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<ICrawler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<ICrawler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<ICrawler>)sVar2.super___shared_ptr<ICrawler,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TInterface> forwardInstance(InjectionContext* context) override
    {
        return std::dynamic_pointer_cast<TInterface>(storage_->getInstance(context));
    }